

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeArrayIndex(ExpressionContext *ctx,SynArrayIndex *syntax)

{
  Allocator *pAVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ExprBase *value_00;
  ArgumentData *pAVar5;
  TypeBase *pTVar6;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  undefined1 local_788 [12];
  ArrayView<ExprBase*> local_778 [20];
  uint local_764;
  undefined1 local_760 [4];
  uint i_2;
  SmallArray<ExprBase_*,_8U> values_1;
  uint i_1;
  undefined4 local_6f8;
  uint local_6ec;
  undefined1 local_6e8 [4];
  uint i;
  SmallArray<ExprBase_*,_8U> values;
  ExprBase *index;
  SynCallArgument *curr;
  SmallArray<ArgumentData,_32U> arguments;
  ExprBase *value;
  SynArrayIndex *syntax_local;
  ExpressionContext *ctx_local;
  
  arguments.allocator = (Allocator *)AnalyzeExpression(ctx,syntax->value);
  SmallArray<ArgumentData,_32U>::SmallArray((SmallArray<ArgumentData,_32U> *)&curr,ctx->allocator);
  for (index = (ExprBase *)(syntax->arguments).head; index != (ExprBase *)0x0;
      index = (ExprBase *)getType<SynCallArgument>((SynBase *)index[1]._vptr_ExprBase)) {
    value_00 = AnalyzeExpression(ctx,(SynBase *)index[1].type);
    ArgumentData::ArgumentData
              ((ArgumentData *)&values.allocator,value_00->source,false,
               (SynIdentifier *)index[1].source,value_00->type,value_00);
    SmallArray<ArgumentData,_32U>::push_back
              ((SmallArray<ArgumentData,_32U> *)&curr,(ArgumentData *)&values.allocator);
  }
  bVar3 = isType<TypeError>((TypeBase *)arguments.allocator[3]._vptr_Allocator);
  if (bVar3) {
    SmallArray<ExprBase_*,_8U>::SmallArray((SmallArray<ExprBase_*,_8U> *)local_6e8,ctx->allocator);
    SmallArray<ExprBase_*,_8U>::push_back
              ((SmallArray<ExprBase_*,_8U> *)local_6e8,(ExprBase **)&arguments.allocator);
    local_6ec = 0;
    while( true ) {
      uVar2 = local_6ec;
      uVar4 = SmallArray<ArgumentData,_32U>::size((SmallArray<ArgumentData,_32U> *)&curr);
      if (uVar4 <= uVar2) break;
      pAVar5 = SmallArray<ArgumentData,_32U>::operator[]
                         ((SmallArray<ArgumentData,_32U> *)&curr,local_6ec);
      SmallArray<ExprBase_*,_8U>::push_back((SmallArray<ExprBase_*,_8U> *)local_6e8,&pAVar5->value);
      local_6ec = local_6ec + 1;
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
    pAVar1 = ctx->allocator;
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ArrayView<ExprBase*>::ArrayView<8u>
              ((ArrayView<ExprBase*> *)&i_1,(SmallArray<ExprBase_*,_8U> *)local_6e8);
    arr._12_4_ = 0;
    arr.data = (ExprBase **)_i_1;
    arr.count = local_6f8;
    ExprError::ExprError((ExprError *)ctx_local,pAVar1,&syntax->super_SynBase,pTVar6,arr);
    values_1.allocator._4_4_ = 1;
    SmallArray<ExprBase_*,_8U>::~SmallArray((SmallArray<ExprBase_*,_8U> *)local_6e8);
  }
  else {
    values_1.allocator._0_4_ = 0;
    while( true ) {
      uVar2 = (uint)values_1.allocator;
      uVar4 = SmallArray<ArgumentData,_32U>::size((SmallArray<ArgumentData,_32U> *)&curr);
      pAVar1 = arguments.allocator;
      if (uVar4 <= uVar2) break;
      pAVar5 = SmallArray<ArgumentData,_32U>::operator[]
                         ((SmallArray<ArgumentData,_32U> *)&curr,(uint)values_1.allocator);
      bVar3 = isType<TypeError>(pAVar5->value->type);
      if (bVar3) {
        SmallArray<ExprBase_*,_8U>::SmallArray
                  ((SmallArray<ExprBase_*,_8U> *)local_760,ctx->allocator);
        SmallArray<ExprBase_*,_8U>::push_back
                  ((SmallArray<ExprBase_*,_8U> *)local_760,(ExprBase **)&arguments.allocator);
        local_764 = 0;
        while( true ) {
          uVar2 = local_764;
          uVar4 = SmallArray<ArgumentData,_32U>::size((SmallArray<ArgumentData,_32U> *)&curr);
          if (uVar4 <= uVar2) break;
          pAVar5 = SmallArray<ArgumentData,_32U>::operator[]
                             ((SmallArray<ArgumentData,_32U> *)&curr,local_764);
          SmallArray<ExprBase_*,_8U>::push_back
                    ((SmallArray<ExprBase_*,_8U> *)local_760,&pAVar5->value);
          local_764 = local_764 + 1;
        }
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
        pAVar1 = ctx->allocator;
        pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ArrayView<ExprBase*>::ArrayView<8u>(local_778,(SmallArray<ExprBase_*,_8U> *)local_760);
        arr_00._12_4_ = 0;
        arr_00._0_12_ = local_778._0_12_;
        ExprError::ExprError((ExprError *)ctx_local,pAVar1,&syntax->super_SynBase,pTVar6,arr_00);
        values_1.allocator._4_4_ = 1;
        SmallArray<ExprBase_*,_8U>::~SmallArray((SmallArray<ExprBase_*,_8U> *)local_760);
        goto LAB_001c4765;
      }
      values_1.allocator._0_4_ = (uint)values_1.allocator + 1;
    }
    ArrayView<ArgumentData>::ArrayView<32u>
              ((ArrayView<ArgumentData> *)local_788,(SmallArray<ArgumentData,_32U> *)&curr);
    arguments_00._12_4_ = 0;
    arguments_00.data = (ArgumentData *)local_788._0_8_;
    arguments_00.count = local_788._8_4_;
    ctx_local = (ExpressionContext *)
                CreateArrayIndex(ctx,&syntax->super_SynBase,(ExprBase *)pAVar1,arguments_00);
    values_1.allocator._4_4_ = 1;
  }
LAB_001c4765:
  SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&curr);
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeArrayIndex(ExpressionContext &ctx, SynArrayIndex *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	for(SynCallArgument *curr = syntax->arguments.head; curr; curr = getType<SynCallArgument>(curr->next))
	{
		ExprBase *index = AnalyzeExpression(ctx, curr->value);

		arguments.push_back(ArgumentData(index->source, false, curr->name, index->type, index));
	}

	if(isType<TypeError>(value->type))
	{
		SmallArray<ExprBase*, 8> values(ctx.allocator);

		values.push_back(value);

		for(unsigned i = 0; i < arguments.size(); i++)
			values.push_back(arguments[i].value);

		return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type))
		{
			SmallArray<ExprBase*, 8> values(ctx.allocator);

			values.push_back(value);

			for(unsigned i = 0; i < arguments.size(); i++)
				values.push_back(arguments[i].value);

			return new (ctx.get<ExprError>()) ExprError(ctx.allocator, syntax, ctx.GetErrorType(), values);
		}
	}

	return CreateArrayIndex(ctx, syntax, value, arguments);
}